

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDec.c
# Opt level: O2

Abc_Obj_t * Lpk_ImplementFun(Lpk_Man_t *pMan,Abc_Ntk_t *pNtk,Vec_Ptr_t *vLeaves,Lpk_Fun_t *p)

{
  Hop_Man_t *pMan_00;
  int iVar1;
  Abc_Obj_t *pObj;
  void *pvVar2;
  Hop_Obj_t *pHVar3;
  uint nVars;
  ulong uVar4;
  undefined1 *pTruth;
  
  if (*(int *)&p->field_0x8 < 0) {
    pMan->nMuxes = pMan->nMuxes + 1;
  }
  else {
    pMan->nDsds = pMan->nDsds + 1;
  }
  pObj = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
  for (uVar4 = 0; uVar4 < (*(uint *)&p->field_0x8 >> 7 & 0x1f); uVar4 = uVar4 + 1) {
    pvVar2 = Vec_PtrEntry(vLeaves,(int)p->pFanins[uVar4]);
    Abc_ObjAddFanin(pObj,(Abc_Obj_t *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  iVar1 = Abc_ObjLevelNew(pObj);
  *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xfff | iVar1 << 0xc;
  pTruth = &p->field_0xe4;
  nVars = *(uint *)&p->field_0x8 >> 7 & 0x1f;
  pMan_00 = (Hop_Man_t *)pNtk->pManFunc;
  if (nVars == 1) {
    pvVar2 = Vec_PtrEntry(pMan_00->vPis,0);
    pHVar3 = (Hop_Obj_t *)((ulong)(*(uint *)pTruth & 1) ^ (ulong)pvVar2);
  }
  else if (nVars == 0) {
    pHVar3 = (Hop_Obj_t *)((ulong)(*(uint *)pTruth & 1) ^ (ulong)pMan_00->pConst1 ^ 1);
  }
  else {
    pHVar3 = Kit_TruthToHop(pMan_00,(uint *)pTruth,nVars,(Vec_Int_t *)0x0);
  }
  (pObj->field_5).pData = pHVar3;
  return pObj;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Implements the function.]

  Description [Returns the node implementing this function.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Obj_t * Lpk_ImplementFun( Lpk_Man_t * pMan, Abc_Ntk_t * pNtk, Vec_Ptr_t * vLeaves, Lpk_Fun_t * p )
{
    extern Hop_Obj_t * Kit_TruthToHop( Hop_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory );
    unsigned * pTruth;
    Abc_Obj_t * pObjNew;
    int i;
    if ( p->fMark )
        pMan->nMuxes++;
    else
        pMan->nDsds++;
    // create the new node
    pObjNew = Abc_NtkCreateNode( pNtk );
    for ( i = 0; i < (int)p->nVars; i++ )
        Abc_ObjAddFanin( pObjNew, Abc_ObjRegular((Abc_Obj_t *)Vec_PtrEntry(vLeaves, p->pFanins[i])) );
    Abc_ObjSetLevel( pObjNew, Abc_ObjLevelNew(pObjNew) );
    // assign the node's function
    pTruth = Lpk_FunTruth(p, 0);
    if ( p->nVars == 0 )
    {
        pObjNew->pData = Hop_NotCond( Hop_ManConst1((Hop_Man_t *)pNtk->pManFunc), !(pTruth[0] & 1) );
        return pObjNew;
    }
    if ( p->nVars == 1 )
    {
        pObjNew->pData = Hop_NotCond( Hop_ManPi((Hop_Man_t *)pNtk->pManFunc, 0), (pTruth[0] & 1) );
        return pObjNew;
    }
    // create the logic function
    pObjNew->pData = Kit_TruthToHop( (Hop_Man_t *)pNtk->pManFunc, pTruth, p->nVars, NULL );
    return pObjNew;
}